

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::WriteTargetDependInfo
          (cmNinjaTargetGenerator *this,string *lang,string *config)

{
  pointer *other;
  pointer *this_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  undefined8 uVar1;
  bool bVar2;
  cmFileSetVisibility vis;
  MessageLevel MVar3;
  Value *pVVar4;
  string *psVar5;
  ulong uVar6;
  reference cge;
  reference ppcVar7;
  mapped_type *ppcVar8;
  cmFileSet *pcVar9;
  reference value;
  pointer ppVar10;
  Value *pVVar11;
  cmMakefile *pcVar12;
  vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  *pvVar13;
  reference this_01;
  pointer pcVar14;
  cmGeneratorTarget *pcVar15;
  cmGlobalNinjaGenerator *pcVar16;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
  *this_02;
  reference ppVar17;
  vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
  *this_03;
  reference ppcVar18;
  vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
  *this_04;
  pointer pcVar19;
  iterator __first;
  iterator __last;
  Value *this_05;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view sVar20;
  cmInstallCxxModuleBmiGenerator *local_1608;
  cmInstallFileSetGenerator *local_14e8;
  undefined1 local_12d8 [8];
  cmGeneratedFileStream tdif;
  string tdin;
  Value local_1028;
  Value local_1000;
  Value local_fd8;
  Value local_fb0;
  Value local_f88;
  string local_f60;
  string *local_f40;
  string *export_prefix_1;
  string dest_1;
  string *cxxm_dir_1;
  string *main_fn;
  String *local_ee8;
  string *ns_1;
  Value tdi_export_info_1;
  bool has_current_target;
  string *name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets_1;
  unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_> *exp_1;
  const_iterator __end1_5;
  const_iterator __begin1_5;
  vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
  *__range1_5;
  vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
  *all_build_exports;
  Value local_e10;
  Value local_de8;
  Value local_dc0;
  Value local_d98;
  Value local_d70;
  string local_d48;
  string *local_d28;
  string *export_prefix;
  String *local_d00;
  string *cxxm_dir;
  string *dest;
  string *ns;
  Value tdi_export_info;
  cmInstallExportGenerator *install;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
  *__range2_4;
  vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
  *installs;
  cmNinjaTargetGenerator *local_c90;
  unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_> *local_c88;
  __normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
  local_c80;
  __normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
  local_c78;
  __normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
  tgt_export;
  vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
  *targets;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>
  *exp;
  const_iterator __end1_4;
  const_iterator __begin1_4;
  cmExportSetMap *__range1_4;
  cmExportSetMap *all_install_exports;
  string local_c18;
  Value local_bf8;
  Value local_bd0;
  char *local_ba8;
  char *msg_level;
  Value local_b80;
  Value local_b58;
  undefined1 local_b30 [8];
  Value tdi_bmi_info;
  cmInstallCxxModuleBmiGenerator *bmig;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *ig_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  *__range1_3;
  cmInstallCxxModuleBmiGenerator *bmi_gen;
  string export_name;
  Value *tdi_exports;
  allocator<char> local_a59;
  string_view local_a58;
  String local_a48;
  Value local_a28;
  Value local_a00;
  Value local_9d8;
  Value local_9b0;
  Value local_988;
  Value local_960;
  Value *local_938;
  Value *tdi_module_info;
  string obj_path;
  cmAlphaNum local_8e0;
  string local_8b0;
  cmSourceFile *local_890;
  cmSourceFile *sf_1;
  cmAlphaNum local_858;
  string local_828;
  _Self local_808;
  _Self local_800;
  iterator lookup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *files_per_dir;
  iterator __end2_3;
  iterator __begin2_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *__range2_3;
  Value local_798;
  cmInstallFileSetGenerator *local_770;
  cmInstallFileSetGenerator *fsg;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *ig;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  *__range2_2;
  Value fs_dest;
  cmAlphaNum local_6f0;
  string local_6c0;
  undefined1 local_6a0 [8];
  string full_path;
  cmSourceFile *sf;
  iterator __end2_1;
  iterator __begin2_1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range2_1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
  sf_map;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entry;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  files_per_dirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  fileEntries;
  string local_548 [8];
  string fs_type;
  cmAlphaNum local_4f8;
  string local_4c8;
  cmFileSet *local_4a8;
  cmFileSet *file_set;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file_set_name;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  Value *local_458;
  Value *tdi_cxx_module_info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_file_sets;
  cmTarget *tgt;
  reference local_408;
  string *l;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  Value *local_3a8;
  Value *tdi_linked_target_dirs;
  reference local_378;
  string *i;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  Value *tdi_include_dirs;
  Value local_2e8;
  Value local_2c0;
  Value local_298;
  allocator<char> local_269;
  string local_268;
  Value local_248;
  allocator<char> local_219;
  string local_218;
  Value local_1f8;
  Value local_1d0;
  string local_1a8;
  string local_188 [32];
  string local_168;
  undefined1 local_148 [8];
  string mod_dir;
  cmAlphaNum local_f8;
  string local_c8;
  Value local_a8;
  Value local_70;
  undefined1 local_48 [8];
  Value tdi;
  string *config_local;
  string *lang_local;
  cmNinjaTargetGenerator *this_local;
  
  tdi.limit_ = (ptrdiff_t)config;
  Json::Value::Value((Value *)local_48,objectValue);
  Json::Value::Value(&local_70,lang);
  pVVar4 = Json::Value::operator[]((Value *)local_48,"language");
  Json::Value::operator=(pVVar4,&local_70);
  Json::Value::~Value(&local_70);
  pcVar12 = (this->super_cmCommonTargetGenerator).Makefile;
  cmAlphaNum::cmAlphaNum(&local_f8,"CMAKE_");
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&mod_dir.field_2 + 8),lang);
  cmStrCat<char[13]>(&local_c8,&local_f8,(cmAlphaNum *)((long)&mod_dir.field_2 + 8),
                     (char (*) [13])0xd5953f);
  psVar5 = cmMakefile::GetSafeDefinition(pcVar12,&local_c8);
  Json::Value::Value(&local_a8,psVar5);
  pVVar4 = Json::Value::operator[]((Value *)local_48,"compiler-id");
  Json::Value::operator=(pVVar4,&local_a8);
  Json::Value::~Value(&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string((string *)local_148);
  bVar2 = std::operator==(lang,"Fortran");
  if (bVar2) {
    pcVar15 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    psVar5 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).Makefile);
    cmGeneratorTarget::GetFortranModuleDirectory(&local_168,pcVar15,psVar5);
    std::__cxx11::string::operator=((string *)local_148,(string *)&local_168);
    std::__cxx11::string::~string((string *)&local_168);
  }
  else {
    bVar2 = std::operator==(lang,"CXX");
    if (bVar2) {
      pcVar16 = GetGlobalGenerator(this);
      cmsys::SystemTools::CollapseFullPath
                (&local_1a8,
                 &((this->super_cmCommonTargetGenerator).GeneratorTarget)->ObjectDirectory);
      (*(pcVar16->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
        [0x16])(local_188,pcVar16,&local_1a8,tdi.limit_);
      std::__cxx11::string::operator=((string *)local_148,local_188);
      std::__cxx11::string::~string(local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
    }
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).Makefile);
    std::__cxx11::string::operator=((string *)local_148,(string *)psVar5);
  }
  Json::Value::Value(&local_1d0,(String *)local_148);
  pVVar4 = Json::Value::operator[]((Value *)local_48,"module-dir");
  Json::Value::operator=(pVVar4,&local_1d0);
  Json::Value::~Value(&local_1d0);
  bVar2 = std::operator==(lang,"Fortran");
  if (bVar2) {
    pcVar12 = (this->super_cmCommonTargetGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,"CMAKE_Fortran_SUBMODULE_SEP",&local_219);
    psVar5 = cmMakefile::GetSafeDefinition(pcVar12,&local_218);
    Json::Value::Value(&local_1f8,psVar5);
    pVVar4 = Json::Value::operator[]((Value *)local_48,"submodule-sep");
    Json::Value::operator=(pVVar4,&local_1f8);
    Json::Value::~Value(&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator(&local_219);
    pcVar12 = (this->super_cmCommonTargetGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,"CMAKE_Fortran_SUBMODULE_EXT",&local_269);
    psVar5 = cmMakefile::GetSafeDefinition(pcVar12,&local_268);
    Json::Value::Value(&local_248,psVar5);
    pVVar4 = Json::Value::operator[]((Value *)local_48,"submodule-ext");
    Json::Value::operator=(pVVar4,&local_248);
    Json::Value::~Value(&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
  }
  else {
    std::operator==(lang,"CXX");
  }
  psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_298,psVar5);
  pVVar4 = Json::Value::operator[]((Value *)local_48,"dir-cur-bld");
  Json::Value::operator=(pVVar4,&local_298);
  Json::Value::~Value(&local_298);
  psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_2c0,psVar5);
  pVVar4 = Json::Value::operator[]((Value *)local_48,"dir-cur-src");
  Json::Value::operator=(pVVar4,&local_2c0);
  Json::Value::~Value(&local_2c0);
  psVar5 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_2e8,psVar5);
  pVVar4 = Json::Value::operator[]((Value *)local_48,"dir-top-bld");
  Json::Value::operator=(pVVar4,&local_2e8);
  Json::Value::~Value(&local_2e8);
  psVar5 = cmMakefile::GetHomeDirectory_abi_cxx11_((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&tdi_include_dirs,psVar5);
  pVVar4 = Json::Value::operator[]((Value *)local_48,"dir-top-src");
  Json::Value::operator=(pVVar4,(Value *)&tdi_include_dirs);
  Json::Value::~Value((Value *)&tdi_include_dirs);
  Json::Value::Value((Value *)&includes.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,arrayValue);
  pVVar4 = Json::Value::operator[]((Value *)local_48,"include-dirs");
  other = &includes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pVVar4 = Json::Value::operator=(pVVar4,(Value *)other);
  Json::Value::~Value((Value *)other);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)this->LocalGenerator,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1,(this->super_cmCommonTargetGenerator).GeneratorTarget,lang,
             (string *)tdi.limit_);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
  i = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&i), bVar2) {
    local_378 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    psVar5 = ConvertToNinjaPath(this,local_378);
    Json::Value::Value((Value *)&tdi_linked_target_dirs,psVar5);
    Json::Value::append(pVVar4,(Value *)&tdi_linked_target_dirs);
    Json::Value::~Value((Value *)&tdi_linked_target_dirs);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  Json::Value::Value((Value *)&__range1_1,arrayValue);
  pVVar4 = Json::Value::operator[]((Value *)local_48,"linked-target-dirs");
  pVVar4 = Json::Value::operator=(pVVar4,(Value *)&__range1_1);
  Json::Value::~Value((Value *)&__range1_1);
  local_3a8 = pVVar4;
  cmCommonTargetGenerator::GetLinkedTargetDirectories
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__begin1_1,&this->super_cmCommonTargetGenerator,(string *)tdi.limit_);
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__begin1_1);
  l = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__begin1_1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&l), bVar2) {
    local_408 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1_1);
    pVVar4 = local_3a8;
    Json::Value::Value((Value *)&tgt,local_408);
    Json::Value::append(pVVar4,(Value *)&tgt);
    Json::Value::~Value((Value *)&tgt);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__begin1_1);
  all_file_sets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((this->super_cmCommonTargetGenerator).GeneratorTarget)->Target;
  cmTarget::GetAllFileSetNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&tdi_cxx_module_info,
             (cmTarget *)
             all_file_sets.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Json::Value::Value((Value *)&__range1_2,objectValue);
  pVVar4 = Json::Value::operator[]((Value *)local_48,"cxx-modules");
  pVVar4 = Json::Value::operator=(pVVar4,(Value *)&__range1_2);
  Json::Value::~Value((Value *)&__range1_2);
  local_458 = pVVar4;
  __end1_2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&tdi_cxx_module_info);
  file_set_name =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&tdi_cxx_module_info);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&file_set_name);
    if (!bVar2) break;
    file_set = (cmFileSet *)
               __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1_2);
    local_4a8 = cmTarget::GetFileSet
                          ((cmTarget *)
                           all_file_sets.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)file_set);
    if (local_4a8 == (cmFileSet *)0x0) {
      pcVar12 = GetMakefile(this);
      cmAlphaNum::cmAlphaNum(&local_4f8,"Target \"");
      psVar5 = cmTarget::GetName_abi_cxx11_
                         ((cmTarget *)
                          all_file_sets.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&fs_type.field_2 + 8),psVar5);
      cmStrCat<char[32],std::__cxx11::string,char[25]>
                (&local_4c8,&local_4f8,(cmAlphaNum *)((long)&fs_type.field_2 + 8),
                 (char (*) [32])"\" is tracked to have file set \"",&file_set->Name,
                 (char (*) [25])"\", but it was not found.");
      cmMakefile::IssueMessage(pcVar12,INTERNAL_ERROR,&local_4c8);
      std::__cxx11::string::~string((string *)&local_4c8);
    }
    else {
      psVar5 = cmFileSet::GetType_abi_cxx11_(local_4a8);
      std::__cxx11::string::string(local_548,(string *)psVar5);
      __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view(local_548);
      __y = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("CXX_MODULES",0xb)
      ;
      bVar2 = std::operator!=(__x,__y);
      if (!bVar2) {
        cmFileSet::CompileFileEntries
                  ((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    *)&directoryEntries.
                       super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,local_4a8);
        cmFileSet::CompileDirectoryEntries
                  ((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    *)&directories.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,local_4a8);
        pcVar15 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
        cmFileSet::EvaluateDirectoryEntries
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_node_count,local_4a8,
                   (vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    *)&directories.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar15->LocalGenerator,
                   (string *)tdi.limit_,pcVar15,(cmGeneratorExpressionDAGChecker *)0x0);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)&__range2);
        this_00 = &directoryEntries.
                   super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        __end2 = std::
                 vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                 ::begin((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                          *)this_00);
        entry = (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)std::
                   vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                   ::end((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                          *)this_00);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            (&__end2,(__normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                                      *)&entry);
          if (!bVar2) break;
          cge = __gnu_cxx::
                __normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                ::operator*(&__end2);
          pcVar15 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
          cmFileSet::EvaluateFileEntry
                    (local_4a8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      *)&__range2,cge,pcVar15->LocalGenerator,(string *)tdi.limit_,pcVar15,
                     (cmGeneratorExpressionDAGChecker *)0x0);
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
          ::operator++(&__end2);
        }
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
               *)&objectSources.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
                  ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                   &__range2_1);
        cmGeneratorTarget::GetObjectSources
                  ((this->super_cmCommonTargetGenerator).GeneratorTarget,
                   (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                   &__range2_1,(string *)tdi.limit_);
        __end2_1 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                             ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *
                              )&__range2_1);
        sf = (cmSourceFile *)
             std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                       ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        &__range2_1);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            (&__end2_1,
                             (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                              *)&sf);
          if (!bVar2) break;
          ppcVar7 = __gnu_cxx::
                    __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                    ::operator*(&__end2_1);
          full_path.field_2._8_8_ = *ppcVar7;
          psVar5 = cmSourceFile::GetFullPath_abi_cxx11_((cmSourceFile *)full_path.field_2._8_8_);
          std::__cxx11::string::string((string *)local_6a0,(string *)psVar5);
          uVar6 = std::__cxx11::string::empty();
          uVar1 = full_path.field_2._8_8_;
          if ((uVar6 & 1) == 0) {
            ppcVar8 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
                                    *)&objectSources.
                                       super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (key_type *)local_6a0);
            *ppcVar8 = (mapped_type)uVar1;
          }
          else {
            pcVar12 = GetMakefile(this);
            cmAlphaNum::cmAlphaNum(&local_6f0,"Target \"");
            psVar5 = cmTarget::GetName_abi_cxx11_
                               ((cmTarget *)
                                all_file_sets.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            cmAlphaNum::cmAlphaNum((cmAlphaNum *)&fs_dest.limit_,psVar5);
            cmStrCat<char[36]>(&local_6c0,&local_6f0,(cmAlphaNum *)&fs_dest.limit_,
                               (char (*) [36])"\" has a full path-less source file.");
            cmMakefile::IssueMessage(pcVar12,INTERNAL_ERROR,&local_6c0);
            std::__cxx11::string::~string((string *)&local_6c0);
          }
          std::__cxx11::string::~string((string *)local_6a0);
          __gnu_cxx::
          __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
          ::operator++(&__end2_1);
        }
        std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
                  ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                   &__range2_1);
        Json::Value::Value((Value *)&__range2_2,nullValue);
        pcVar12 = GetMakefile(this);
        pvVar13 = cmMakefile::GetInstallGenerators(pcVar12);
        __end2_2 = std::
                   vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                   ::begin(pvVar13);
        ig = (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
             std::
             vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
             ::end(pvVar13);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            (&__end2_2,
                             (__normal_iterator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
                              *)&ig);
          if (!bVar2) break;
          fsg = (cmInstallFileSetGenerator *)
                __gnu_cxx::
                __normal_iterator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
                ::operator*(&__end2_2);
          pcVar14 = std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>::
                    get((unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                        fsg);
          if (pcVar14 == (pointer)0x0) {
            local_14e8 = (cmInstallFileSetGenerator *)0x0;
          }
          else {
            local_14e8 = (cmInstallFileSetGenerator *)
                         __dynamic_cast(pcVar14,&cmInstallGenerator::typeinfo,
                                        &cmInstallFileSetGenerator::typeinfo,0);
          }
          local_770 = local_14e8;
          if (local_14e8 != (cmInstallFileSetGenerator *)0x0) {
            pcVar15 = cmInstallFileSetGenerator::GetTarget(local_14e8);
            if (pcVar15 == (this->super_cmCommonTargetGenerator).GeneratorTarget) {
              pcVar9 = cmInstallFileSetGenerator::GetFileSet(local_770);
              if (pcVar9 == local_4a8) {
                cmInstallFileSetGenerator::GetDestination
                          ((string *)&__range2_3,local_770,(string *)tdi.limit_);
                Json::Value::Value(&local_798,(String *)&__range2_3);
                Json::Value::operator=((Value *)&__range2_2,&local_798);
                Json::Value::~Value(&local_798);
                std::__cxx11::string::~string((string *)&__range2_3);
              }
            }
          }
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
          ::operator++(&__end2_2);
        }
        __end2_3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            *)&__range2);
        files_per_dir =
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       *)&__range2);
        while( true ) {
          bVar2 = std::operator!=(&__end2_3,(_Self *)&files_per_dir);
          if (!bVar2) break;
          value = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator*(&__end2_3);
          __end3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&value->second);
          file = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&value->second);
          while( true ) {
            bVar2 = __gnu_cxx::operator!=
                              (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)&file);
            if (!bVar2) break;
            lookup._M_node =
                 (_Base_ptr)
                 __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3);
            local_800._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
                 ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
                         *)&objectSources.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (key_type *)lookup._M_node);
            local_808._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
                        *)&objectSources.
                           super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
            bVar2 = std::operator==(&local_800,&local_808);
            if (bVar2) {
              pcVar12 = GetMakefile(this);
              cmAlphaNum::cmAlphaNum(&local_858,"Target \"");
              psVar5 = cmTarget::GetName_abi_cxx11_
                                 ((cmTarget *)
                                  all_file_sets.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              cmAlphaNum::cmAlphaNum((cmAlphaNum *)&sf_1,psVar5);
              cmStrCat<char[20],std::__cxx11::string,char[51]>
                        (&local_828,&local_858,(cmAlphaNum *)&sf_1,
                         (char (*) [20])"\" has source file \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         lookup._M_node,
                         (char (*) [51])"\" which is not in any of its \"FILE_SET BASE_DIRS\".");
              cmMakefile::IssueMessage(pcVar12,INTERNAL_ERROR,&local_828);
              std::__cxx11::string::~string((string *)&local_828);
            }
            else {
              ppVar10 = std::
                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>
                        ::operator->(&local_800);
              local_890 = ppVar10->second;
              if (local_890 == (cmSourceFile *)0x0) {
                pcVar12 = GetMakefile(this);
                cmAlphaNum::cmAlphaNum(&local_8e0,"Target \"");
                psVar5 = cmTarget::GetName_abi_cxx11_
                                   ((cmTarget *)
                                    all_file_sets.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&obj_path.field_2 + 8),psVar5);
                cmStrCat<char[20],std::__cxx11::string,char[39]>
                          (&local_8b0,&local_8e0,(cmAlphaNum *)((long)&obj_path.field_2 + 8),
                           (char (*) [20])"\" has source file \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           lookup._M_node,(char (*) [39])"\" which has not been tracked properly.");
                cmMakefile::IssueMessage(pcVar12,INTERNAL_ERROR,&local_8b0);
                std::__cxx11::string::~string((string *)&local_8b0);
              }
              else {
                GetObjectFilePath((string *)&tdi_module_info,this,local_890,(string *)tdi.limit_);
                Json::Value::Value(&local_960,objectValue);
                pVVar4 = Json::Value::operator[](local_458,(String *)&tdi_module_info);
                pVVar4 = Json::Value::operator=(pVVar4,&local_960);
                Json::Value::~Value(&local_960);
                local_938 = pVVar4;
                Json::Value::Value(&local_988,(String *)lookup._M_node);
                pVVar4 = Json::Value::operator[](local_938,"source");
                Json::Value::operator=(pVVar4,&local_988);
                Json::Value::~Value(&local_988);
                Json::Value::Value(&local_9b0,&value->first);
                pVVar4 = Json::Value::operator[](local_938,"relative-directory");
                Json::Value::operator=(pVVar4,&local_9b0);
                Json::Value::~Value(&local_9b0);
                psVar5 = cmFileSet::GetName_abi_cxx11_(local_4a8);
                Json::Value::Value(&local_9d8,psVar5);
                pVVar4 = Json::Value::operator[](local_938,"name");
                Json::Value::operator=(pVVar4,&local_9d8);
                Json::Value::~Value(&local_9d8);
                psVar5 = cmFileSet::GetType_abi_cxx11_(local_4a8);
                Json::Value::Value(&local_a00,psVar5);
                pVVar4 = Json::Value::operator[](local_938,"type");
                Json::Value::operator=(pVVar4,&local_a00);
                Json::Value::~Value(&local_a00);
                vis = cmFileSet::GetVisibility(local_4a8);
                sVar20 = (string_view)cmFileSetVisibilityToName(vis);
                local_a58 = sVar20;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<cm::static_string_view,void>
                          ((string *)&local_a48,(static_string_view *)&local_a58,&local_a59);
                Json::Value::Value(&local_a28,&local_a48);
                pVVar4 = Json::Value::operator[](local_938,"visibility");
                Json::Value::operator=(pVVar4,&local_a28);
                Json::Value::~Value(&local_a28);
                std::__cxx11::string::~string((string *)&local_a48);
                std::allocator<char>::~allocator(&local_a59);
                pVVar4 = Json::Value::operator[](local_938,"destination");
                Json::Value::operator=(pVVar4,(Value *)&__range2_2);
                std::__cxx11::string::~string((string *)&tdi_module_info);
              }
            }
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end3);
          }
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator++(&__end2_3);
        }
        Json::Value::~Value((Value *)&__range2_2);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmSourceFile_*>_>_>
                *)&objectSources.
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                *)&__range2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::
        vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
        ::~vector((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                   *)&directories.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
        ::~vector((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                   *)&directoryEntries.
                      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::__cxx11::string::~string(local_548);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_2);
  }
  Json::Value::Value((Value *)&tdi_exports,(String *)tdi.limit_);
  pVVar4 = Json::Value::operator[]((Value *)local_48,"config");
  Json::Value::operator=(pVVar4,(Value *)&tdi_exports);
  Json::Value::~Value((Value *)&tdi_exports);
  Json::Value::Value((Value *)((long)&export_name.field_2 + 8),arrayValue);
  pVVar11 = Json::Value::operator[]((Value *)local_48,"exports");
  pVVar4 = (Value *)((long)&export_name.field_2 + 8);
  pVVar11 = Json::Value::operator=(pVVar11,pVVar4);
  Json::Value::~Value(pVVar4);
  cmGeneratorTarget::GetExportName_abi_cxx11_
            ((string *)&bmi_gen,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  __range1_3 = (vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                *)0x0;
  pcVar12 = GetMakefile(this);
  pvVar13 = cmMakefile::GetInstallGenerators(pcVar12);
  __end1_3 = std::
             vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
             ::begin(pvVar13);
  ig_1 = (unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
         std::
         vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
         ::end(pvVar13);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_3,
                       (__normal_iterator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
                        *)&ig_1);
    if (!bVar2) break;
    this_01 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
              ::operator*(&__end1_3);
    pcVar14 = std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>::get
                        (this_01);
    if (pcVar14 == (pointer)0x0) {
      local_1608 = (cmInstallCxxModuleBmiGenerator *)0x0;
    }
    else {
      local_1608 = (cmInstallCxxModuleBmiGenerator *)
                   __dynamic_cast(pcVar14,&cmInstallGenerator::typeinfo,
                                  &cmInstallCxxModuleBmiGenerator::typeinfo,0);
    }
    tdi_bmi_info.limit_ = (ptrdiff_t)local_1608;
    if (local_1608 != (cmInstallCxxModuleBmiGenerator *)0x0) {
      pcVar15 = cmInstallCxxModuleBmiGenerator::GetTarget(local_1608);
      if (pcVar15 == (this->super_cmCommonTargetGenerator).GeneratorTarget) {
        __range1_3 = (vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                      *)tdi_bmi_info.limit_;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_*,_std::vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>_>
    ::operator++(&__end1_3);
  }
  if (__range1_3 ==
      (vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
       *)0x0) {
    Json::Value::Value((Value *)&all_install_exports,nullValue);
    pVVar4 = Json::Value::operator[]((Value *)local_48,"bmi-installation");
    Json::Value::operator=(pVVar4,(Value *)&all_install_exports);
    Json::Value::~Value((Value *)&all_install_exports);
  }
  else {
    Json::Value::Value((Value *)local_b30,objectValue);
    psVar5 = cmInstallCxxModuleBmiGenerator::GetFilePermissions_abi_cxx11_
                       ((cmInstallCxxModuleBmiGenerator *)__range1_3);
    Json::Value::Value(&local_b58,psVar5);
    pVVar4 = Json::Value::operator[]((Value *)local_b30,"permissions");
    Json::Value::operator=(pVVar4,&local_b58);
    Json::Value::~Value(&local_b58);
    cmInstallCxxModuleBmiGenerator::GetDestination
              ((string *)&msg_level,(cmInstallCxxModuleBmiGenerator *)__range1_3,
               (string *)tdi.limit_);
    Json::Value::Value(&local_b80,(String *)&msg_level);
    pVVar4 = Json::Value::operator[]((Value *)local_b30,"destination");
    Json::Value::operator=(pVVar4,&local_b80);
    Json::Value::~Value(&local_b80);
    std::__cxx11::string::~string((string *)&msg_level);
    local_ba8 = "";
    MVar3 = cmInstallCxxModuleBmiGenerator::GetMessageLevel
                      ((cmInstallCxxModuleBmiGenerator *)__range1_3);
    switch(MVar3) {
    case MessageDefault:
      break;
    case MessageAlways:
      local_ba8 = "MESSAGE_ALWAYS";
      break;
    case MessageLazy:
      local_ba8 = "MESSAGE_LAZY";
      break;
    case MessageNever:
      local_ba8 = "MESSAGE_NEVER";
    }
    Json::Value::Value(&local_bd0,local_ba8);
    pVVar4 = Json::Value::operator[]((Value *)local_b30,"message-level");
    Json::Value::operator=(pVVar4,&local_bd0);
    Json::Value::~Value(&local_bd0);
    cmInstallCxxModuleBmiGenerator::GetScriptLocation
              (&local_c18,(cmInstallCxxModuleBmiGenerator *)__range1_3,(string *)tdi.limit_);
    Json::Value::Value(&local_bf8,&local_c18);
    pVVar4 = Json::Value::operator[]((Value *)local_b30,"script-location");
    Json::Value::operator=(pVVar4,&local_bf8);
    Json::Value::~Value(&local_bf8);
    std::__cxx11::string::~string((string *)&local_c18);
    pVVar4 = Json::Value::operator[]((Value *)local_48,"bmi-installation");
    Json::Value::operator=(pVVar4,(Value *)local_b30);
    Json::Value::~Value((Value *)local_b30);
  }
  pcVar16 = GetGlobalGenerator(this);
  this_02 = &cmGlobalGenerator::GetExportSets((cmGlobalGenerator *)pcVar16)->
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
  ;
  __end1_4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
             ::begin(this_02);
  exp = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
           ::end(this_02);
  while( true ) {
    bVar2 = std::operator!=(&__end1_4,(_Self *)&exp);
    if (!bVar2) break;
    ppVar17 = std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>
              ::operator*(&__end1_4);
    tgt_export._M_current =
         (unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_> *)
         cmExportSet::GetTargetExports(&ppVar17->second);
    local_c80._M_current =
         (unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_> *)
         std::
         vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
         ::begin((vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                  *)tgt_export._M_current);
    local_c88 = (unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_> *)
                std::
                vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                ::end((vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                       *)tgt_export._M_current);
    local_c90 = this;
    local_c78 = std::
                find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<cmTargetExport,std::default_delete<cmTargetExport>>const*,std::vector<std::unique_ptr<cmTargetExport,std::default_delete<cmTargetExport>>,std::allocator<std::unique_ptr<cmTargetExport,std::default_delete<cmTargetExport>>>>>,cmNinjaTargetGenerator::WriteTargetDependInfo(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                          (local_c80,
                           (__normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
                            )local_c88,(anon_class_8_1_8991fb9c_for__M_pred)this);
    installs = (vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
                *)std::
                  vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                  ::end((vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                         *)tgt_export._M_current);
    bVar2 = __gnu_cxx::operator==
                      (&local_c78,
                       (__normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
                        *)&installs);
    if (!bVar2) {
      this_03 = cmExportSet::GetInstallations(&ppVar17->second);
      __end2_4 = std::
                 vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
                 ::begin(this_03);
      install = (cmInstallExportGenerator *)
                std::
                vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
                ::end(this_03);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end2_4,
                           (__normal_iterator<const_cmInstallExportGenerator_*const_*,_std::vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>_>
                            *)&install);
        if (!bVar2) break;
        ppcVar18 = __gnu_cxx::
                   __normal_iterator<const_cmInstallExportGenerator_*const_*,_std::vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>_>
                   ::operator*(&__end2_4);
        tdi_export_info.limit_ = (ptrdiff_t)*ppcVar18;
        Json::Value::Value((Value *)&ns,objectValue);
        dest = cmInstallExportGenerator::GetNamespace_abi_cxx11_
                         ((cmInstallExportGenerator *)tdi_export_info.limit_);
        cxxm_dir = cmInstallExportGenerator::GetDestination_abi_cxx11_
                             ((cmInstallExportGenerator *)tdi_export_info.limit_);
        cmInstallExportGenerator::GetCxxModuleDirectory_abi_cxx11_
                  ((string *)&export_prefix,(cmInstallExportGenerator *)tdi_export_info.limit_);
        local_d00 = (String *)&export_prefix;
        cmInstallExportGenerator::GetTempDir_abi_cxx11_
                  (&local_d48,(cmInstallExportGenerator *)tdi_export_info.limit_);
        local_d28 = &local_d48;
        Json::Value::Value(&local_d70,dest);
        pVVar4 = Json::Value::operator[]((Value *)&ns,"namespace");
        Json::Value::operator=(pVVar4,&local_d70);
        Json::Value::~Value(&local_d70);
        Json::Value::Value(&local_d98,(String *)&bmi_gen);
        pVVar4 = Json::Value::operator[]((Value *)&ns,"export-name");
        Json::Value::operator=(pVVar4,&local_d98);
        Json::Value::~Value(&local_d98);
        Json::Value::Value(&local_dc0,cxxm_dir);
        pVVar4 = Json::Value::operator[]((Value *)&ns,"destination");
        Json::Value::operator=(pVVar4,&local_dc0);
        Json::Value::~Value(&local_dc0);
        Json::Value::Value(&local_de8,local_d00);
        pVVar4 = Json::Value::operator[]((Value *)&ns,"cxx-module-info-dir");
        Json::Value::operator=(pVVar4,&local_de8);
        Json::Value::~Value(&local_de8);
        Json::Value::Value(&local_e10,local_d28);
        pVVar4 = Json::Value::operator[]((Value *)&ns,"export-prefix");
        Json::Value::operator=(pVVar4,&local_e10);
        Json::Value::~Value(&local_e10);
        Json::Value::Value((Value *)&all_build_exports,true);
        pVVar4 = Json::Value::operator[]((Value *)&ns,"install");
        Json::Value::operator=(pVVar4,(Value *)&all_build_exports);
        Json::Value::~Value((Value *)&all_build_exports);
        Json::Value::append(pVVar11,(Value *)&ns);
        std::__cxx11::string::~string((string *)&local_d48);
        std::__cxx11::string::~string((string *)&export_prefix);
        Json::Value::~Value((Value *)&ns);
        __gnu_cxx::
        __normal_iterator<const_cmInstallExportGenerator_*const_*,_std::vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>_>
        ::operator++(&__end2_4);
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>
    ::operator++(&__end1_4);
  }
  pcVar12 = GetMakefile(this);
  this_04 = cmMakefile::GetExportBuildFileGenerators(pcVar12);
  __end1_5 = std::
             vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
             ::begin(this_04);
  exp_1 = (unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
           *)std::
             vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
             ::end(this_04);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_5,
                       (__normal_iterator<const_std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_*,_std::vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>_>
                        *)&exp_1);
    if (!bVar2) break;
    targets_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_*,_std::vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>_>
                  ::operator*(&__end1_5);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&name);
    pcVar19 = std::
              unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
              ::operator->((unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                            *)targets_1.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmExportBuildFileGenerator::GetTargets
              (pcVar19,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&name);
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&name);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&name);
    std::__cxx11::string::string((string *)&tdi_export_info_1.limit_,(string *)psVar5);
    bVar2 = std::
            any_of<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmNinjaTargetGenerator::WriteTargetDependInfo(std::__cxx11::string_const&,std::__cxx11::string_const&)::__1>
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )__first._M_current,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )__last._M_current,
                       (anon_class_32_1_898f2789_for__M_pred *)&tdi_export_info_1.limit_);
    WriteTargetDependInfo(std::__cxx11::string_const&,std::__cxx11::string_const&)::$_1::~__1
              ((__1 *)&tdi_export_info_1.limit_);
    if (bVar2) {
      Json::Value::Value((Value *)&ns_1,objectValue);
      pcVar19 = std::
                unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                ::operator->((unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                              *)targets_1.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmExportFileGenerator::GetNamespace_abi_cxx11_
                ((string *)&main_fn,&pcVar19->super_cmExportFileGenerator);
      local_ee8 = (String *)&main_fn;
      pcVar19 = std::
                unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                ::operator->((unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                              *)targets_1.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      psVar5 = cmExportFileGenerator::GetMainExportFileName_abi_cxx11_
                         (&pcVar19->super_cmExportFileGenerator);
      pcVar19 = std::
                unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                ::operator->((unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                              *)targets_1.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      dest_1.field_2._8_8_ = cmExportBuildFileGenerator::GetCxxModuleDirectory_abi_cxx11_(pcVar19);
      cmsys::SystemTools::GetParentDirectory((string *)&export_prefix_1,psVar5);
      pcVar19 = std::
                unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                ::operator->((unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                              *)targets_1.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      psVar5 = cmExportFileGenerator::GetMainExportFileName_abi_cxx11_
                         (&pcVar19->super_cmExportFileGenerator);
      cmsys::SystemTools::GetFilenamePath(&local_f60,psVar5);
      local_f40 = &local_f60;
      Json::Value::Value(&local_f88,local_ee8);
      pVVar4 = Json::Value::operator[]((Value *)&ns_1,"namespace");
      Json::Value::operator=(pVVar4,&local_f88);
      Json::Value::~Value(&local_f88);
      Json::Value::Value(&local_fb0,(String *)&bmi_gen);
      pVVar4 = Json::Value::operator[]((Value *)&ns_1,"export-name");
      Json::Value::operator=(pVVar4,&local_fb0);
      Json::Value::~Value(&local_fb0);
      Json::Value::Value(&local_fd8,(String *)&export_prefix_1);
      pVVar4 = Json::Value::operator[]((Value *)&ns_1,"destination");
      Json::Value::operator=(pVVar4,&local_fd8);
      Json::Value::~Value(&local_fd8);
      Json::Value::Value(&local_1000,(String *)dest_1.field_2._8_8_);
      pVVar4 = Json::Value::operator[]((Value *)&ns_1,"cxx-module-info-dir");
      Json::Value::operator=(pVVar4,&local_1000);
      Json::Value::~Value(&local_1000);
      Json::Value::Value(&local_1028,local_f40);
      pVVar4 = Json::Value::operator[]((Value *)&ns_1,"export-prefix");
      Json::Value::operator=(pVVar4,&local_1028);
      Json::Value::~Value(&local_1028);
      Json::Value::Value((Value *)((long)&tdin.field_2 + 8),false);
      this_05 = Json::Value::operator[]((Value *)&ns_1,"install");
      pVVar4 = (Value *)((long)&tdin.field_2 + 8);
      Json::Value::operator=(this_05,pVVar4);
      Json::Value::~Value(pVVar4);
      Json::Value::append(pVVar11,(Value *)&ns_1);
      std::__cxx11::string::~string((string *)&local_f60);
      std::__cxx11::string::~string((string *)&export_prefix_1);
      std::__cxx11::string::~string((string *)&main_fn);
      Json::Value::~Value((Value *)&ns_1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&name);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_*,_std::vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>_>
    ::operator++(&__end1_5);
  }
  GetTargetDependInfoPath((string *)&tdif.field_0x260,this,lang,(string *)tdi.limit_);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_12d8,(string *)&tdif.field_0x260,false,None);
  Json::operator<<((OStream *)local_12d8,(Value *)local_48);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_12d8);
  std::__cxx11::string::~string((string *)&tdif.field_0x260);
  std::__cxx11::string::~string((string *)&bmi_gen);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tdi_cxx_module_info);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  std::__cxx11::string::~string((string *)local_148);
  Json::Value::~Value((Value *)local_48);
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteTargetDependInfo(std::string const& lang,
                                                   const std::string& config)
{
  Json::Value tdi(Json::objectValue);
  tdi["language"] = lang;
  tdi["compiler-id"] = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILER_ID"));

  std::string mod_dir;
  if (lang == "Fortran") {
    mod_dir = this->GeneratorTarget->GetFortranModuleDirectory(
      this->Makefile->GetHomeOutputDirectory());
  } else if (lang == "CXX") {
    mod_dir = this->GetGlobalGenerator()->ExpandCFGIntDir(
      cmSystemTools::CollapseFullPath(this->GeneratorTarget->ObjectDirectory),
      config);
  }
  if (mod_dir.empty()) {
    mod_dir = this->Makefile->GetCurrentBinaryDirectory();
  }
  tdi["module-dir"] = mod_dir;

  if (lang == "Fortran") {
    tdi["submodule-sep"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_SEP");
    tdi["submodule-ext"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_EXT");
  } else if (lang == "CXX") {
    // No extra information necessary.
  }

  tdi["dir-cur-bld"] = this->Makefile->GetCurrentBinaryDirectory();
  tdi["dir-cur-src"] = this->Makefile->GetCurrentSourceDirectory();
  tdi["dir-top-bld"] = this->Makefile->GetHomeOutputDirectory();
  tdi["dir-top-src"] = this->Makefile->GetHomeDirectory();

  Json::Value& tdi_include_dirs = tdi["include-dirs"] = Json::arrayValue;
  std::vector<std::string> includes;
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              lang, config);
  for (std::string const& i : includes) {
    // Convert the include directories the same way we do for -I flags.
    // See upstream ninja issue 1251.
    tdi_include_dirs.append(this->ConvertToNinjaPath(i));
  }

  Json::Value& tdi_linked_target_dirs = tdi["linked-target-dirs"] =
    Json::arrayValue;
  for (std::string const& l : this->GetLinkedTargetDirectories(config)) {
    tdi_linked_target_dirs.append(l);
  }

  cmTarget* tgt = this->GeneratorTarget->Target;
  auto all_file_sets = tgt->GetAllFileSetNames();
  Json::Value& tdi_cxx_module_info = tdi["cxx-modules"] = Json::objectValue;
  for (auto const& file_set_name : all_file_sets) {
    auto* file_set = tgt->GetFileSet(file_set_name);
    if (!file_set) {
      this->GetMakefile()->IssueMessage(
        MessageType::INTERNAL_ERROR,
        cmStrCat("Target \"", tgt->GetName(),
                 "\" is tracked to have file set \"", file_set_name,
                 "\", but it was not found."));
      continue;
    }
    auto fs_type = file_set->GetType();
    // We only care about C++ module sources here.
    if (fs_type != "CXX_MODULES"_s) {
      continue;
    }

    auto fileEntries = file_set->CompileFileEntries();
    auto directoryEntries = file_set->CompileDirectoryEntries();

    auto directories = file_set->EvaluateDirectoryEntries(
      directoryEntries, this->GeneratorTarget->LocalGenerator, config,
      this->GeneratorTarget);
    std::map<std::string, std::vector<std::string>> files_per_dirs;
    for (auto const& entry : fileEntries) {
      file_set->EvaluateFileEntry(directories, files_per_dirs, entry,
                                  this->GeneratorTarget->LocalGenerator,
                                  config, this->GeneratorTarget);
    }

    std::map<std::string, cmSourceFile const*> sf_map;
    {
      std::vector<cmSourceFile const*> objectSources;
      this->GeneratorTarget->GetObjectSources(objectSources, config);
      for (auto const* sf : objectSources) {
        auto full_path = sf->GetFullPath();
        if (full_path.empty()) {
          this->GetMakefile()->IssueMessage(
            MessageType::INTERNAL_ERROR,
            cmStrCat("Target \"", tgt->GetName(),
                     "\" has a full path-less source file."));
          continue;
        }
        sf_map[full_path] = sf;
      }
    }

    Json::Value fs_dest = Json::nullValue;
    for (auto const& ig : this->GetMakefile()->GetInstallGenerators()) {
      if (auto const* fsg =
            dynamic_cast<cmInstallFileSetGenerator const*>(ig.get())) {
        if (fsg->GetTarget() == this->GeneratorTarget &&
            fsg->GetFileSet() == file_set) {
          fs_dest = fsg->GetDestination(config);
          continue;
        }
      }
    }

    for (auto const& files_per_dir : files_per_dirs) {
      for (auto const& file : files_per_dir.second) {
        auto lookup = sf_map.find(file);
        if (lookup == sf_map.end()) {
          this->GetMakefile()->IssueMessage(
            MessageType::INTERNAL_ERROR,
            cmStrCat("Target \"", tgt->GetName(), "\" has source file \"",
                     file,
                     R"(" which is not in any of its "FILE_SET BASE_DIRS".)"));
          continue;
        }

        auto const* sf = lookup->second;

        if (!sf) {
          this->GetMakefile()->IssueMessage(
            MessageType::INTERNAL_ERROR,
            cmStrCat("Target \"", tgt->GetName(), "\" has source file \"",
                     file, "\" which has not been tracked properly."));
          continue;
        }

        auto obj_path = this->GetObjectFilePath(sf, config);
        Json::Value& tdi_module_info = tdi_cxx_module_info[obj_path] =
          Json::objectValue;

        tdi_module_info["source"] = file;
        tdi_module_info["relative-directory"] = files_per_dir.first;
        tdi_module_info["name"] = file_set->GetName();
        tdi_module_info["type"] = file_set->GetType();
        tdi_module_info["visibility"] =
          std::string(cmFileSetVisibilityToName(file_set->GetVisibility()));
        tdi_module_info["destination"] = fs_dest;
      }
    }
  }

  tdi["config"] = config;

  // Add information about the export sets that this target is a member of.
  Json::Value& tdi_exports = tdi["exports"] = Json::arrayValue;
  std::string export_name = this->GeneratorTarget->GetExportName();

  cmInstallCxxModuleBmiGenerator const* bmi_gen = nullptr;
  for (auto const& ig : this->GetMakefile()->GetInstallGenerators()) {
    if (auto const* bmig =
          dynamic_cast<cmInstallCxxModuleBmiGenerator const*>(ig.get())) {
      if (bmig->GetTarget() == this->GeneratorTarget) {
        bmi_gen = bmig;
        continue;
      }
    }
  }
  if (bmi_gen) {
    Json::Value tdi_bmi_info = Json::objectValue;

    tdi_bmi_info["permissions"] = bmi_gen->GetFilePermissions();
    tdi_bmi_info["destination"] = bmi_gen->GetDestination(config);
    const char* msg_level = "";
    switch (bmi_gen->GetMessageLevel()) {
      case cmInstallGenerator::MessageDefault:
        break;
      case cmInstallGenerator::MessageAlways:
        msg_level = "MESSAGE_ALWAYS";
        break;
      case cmInstallGenerator::MessageLazy:
        msg_level = "MESSAGE_LAZY";
        break;
      case cmInstallGenerator::MessageNever:
        msg_level = "MESSAGE_NEVER";
        break;
    }
    tdi_bmi_info["message-level"] = msg_level;
    tdi_bmi_info["script-location"] = bmi_gen->GetScriptLocation(config);

    tdi["bmi-installation"] = tdi_bmi_info;
  } else {
    tdi["bmi-installation"] = Json::nullValue;
  }

  auto const& all_install_exports =
    this->GetGlobalGenerator()->GetExportSets();
  for (auto const& exp : all_install_exports) {
    // Ignore exports sets which are not for this target.
    auto const& targets = exp.second.GetTargetExports();
    auto tgt_export =
      std::find_if(targets.begin(), targets.end(),
                   [this](std::unique_ptr<cmTargetExport> const& te) {
                     return te->Target == this->GeneratorTarget;
                   });
    if (tgt_export == targets.end()) {
      continue;
    }

    auto const* installs = exp.second.GetInstallations();
    for (auto const* install : *installs) {
      Json::Value tdi_export_info = Json::objectValue;

      auto const& ns = install->GetNamespace();
      auto const& dest = install->GetDestination();
      auto const& cxxm_dir = install->GetCxxModuleDirectory();
      auto const& export_prefix = install->GetTempDir();

      tdi_export_info["namespace"] = ns;
      tdi_export_info["export-name"] = export_name;
      tdi_export_info["destination"] = dest;
      tdi_export_info["cxx-module-info-dir"] = cxxm_dir;
      tdi_export_info["export-prefix"] = export_prefix;
      tdi_export_info["install"] = true;

      tdi_exports.append(tdi_export_info);
    }
  }

  auto const& all_build_exports =
    this->GetMakefile()->GetExportBuildFileGenerators();
  for (auto const& exp : all_build_exports) {
    std::vector<std::string> targets;
    exp->GetTargets(targets);

    // Ignore exports sets which are not for this target.
    auto const& name = this->GeneratorTarget->GetName();
    bool has_current_target =
      std::any_of(targets.begin(), targets.end(),
                  [name](std::string const& tname) { return tname == name; });
    if (!has_current_target) {
      continue;
    }

    Json::Value tdi_export_info = Json::objectValue;

    auto const& ns = exp->GetNamespace();
    auto const& main_fn = exp->GetMainExportFileName();
    auto const& cxxm_dir = exp->GetCxxModuleDirectory();
    auto dest = cmsys::SystemTools::GetParentDirectory(main_fn);
    auto const& export_prefix =
      cmSystemTools::GetFilenamePath(exp->GetMainExportFileName());

    tdi_export_info["namespace"] = ns;
    tdi_export_info["export-name"] = export_name;
    tdi_export_info["destination"] = dest;
    tdi_export_info["cxx-module-info-dir"] = cxxm_dir;
    tdi_export_info["export-prefix"] = export_prefix;
    tdi_export_info["install"] = false;

    tdi_exports.append(tdi_export_info);
  }

  std::string const tdin = this->GetTargetDependInfoPath(lang, config);
  cmGeneratedFileStream tdif(tdin);
  tdif << tdi;
}